

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O0

_Bool need_zero_prefix(uint64_t imm)

{
  uint64_t imm_local;
  
  for (imm_local = imm; 0xf < imm_local; imm_local = imm_local >> 4) {
  }
  return 9 < imm_local;
}

Assistant:

static bool need_zero_prefix(uint64_t imm)
{
	// find the first hex letter representing imm
	while(imm >= 0x10)
		imm >>= 4;

	if (imm < 0xa)
		return false;
	else	// this need 0 prefix
		return true;
}